

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorNinePatch.cpp
# Opt level: O3

void __thiscall
Rml::DecoratorNinePatchInstancer::DecoratorNinePatchInstancer(DecoratorNinePatchInstancer *this)

{
  EffectSpecification *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  code *pcVar4;
  PropertyId PVar5;
  bool bVar6;
  PropertyDefinition *pPVar7;
  String local_b0;
  String local_90;
  String local_70;
  String local_50;
  
  DecoratorInstancer::DecoratorInstancer(&this->super_DecoratorInstancer);
  (this->super_DecoratorInstancer)._vptr_DecoratorInstancer =
       (_func_int **)&PTR__DecoratorNinePatchInstancer_0032ef50;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"outer","");
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  this_00 = &(this->super_DecoratorInstancer).super_EffectSpecification;
  pPVar7 = EffectSpecification::RegisterProperty(this_00,&local_b0,&local_90);
  paVar2 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"string","");
  paVar3 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pPVar7 = PropertyDefinition::AddParser(pPVar7,&local_50,&local_70);
  PVar5 = PropertyDefinition::GetId(pPVar7);
  this->sprite_outer_id = PVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"inner","");
  local_90._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  pPVar7 = EffectSpecification::RegisterProperty(this_00,&local_b0,&local_90);
  local_50._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"string","");
  local_70._M_dataplus._M_p = (pointer)paVar3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pPVar7 = PropertyDefinition::AddParser(pPVar7,&local_50,&local_70);
  PVar5 = PropertyDefinition::GetId(pPVar7);
  this->sprite_inner_id = PVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"edge-top","");
  local_90._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"0px","");
  pPVar7 = EffectSpecification::RegisterProperty(this_00,&local_b0,&local_90);
  local_50._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"number_length_percent","");
  local_70._M_dataplus._M_p = (pointer)paVar3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pPVar7 = PropertyDefinition::AddParser(pPVar7,&local_50,&local_70);
  PVar5 = PropertyDefinition::GetId(pPVar7);
  this->edge_ids[0] = PVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"edge-right","");
  local_90._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"0px","");
  pPVar7 = EffectSpecification::RegisterProperty(this_00,&local_b0,&local_90);
  local_50._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"number_length_percent","");
  local_70._M_dataplus._M_p = (pointer)paVar3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pPVar7 = PropertyDefinition::AddParser(pPVar7,&local_50,&local_70);
  PVar5 = PropertyDefinition::GetId(pPVar7);
  this->edge_ids[1] = PVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"edge-bottom","");
  local_90._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"0px","");
  pPVar7 = EffectSpecification::RegisterProperty(this_00,&local_b0,&local_90);
  local_50._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"number_length_percent","");
  local_70._M_dataplus._M_p = (pointer)paVar3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pPVar7 = PropertyDefinition::AddParser(pPVar7,&local_50,&local_70);
  PVar5 = PropertyDefinition::GetId(pPVar7);
  this->edge_ids[2] = PVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"edge-left","");
  local_90._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"0px","");
  pPVar7 = EffectSpecification::RegisterProperty(this_00,&local_b0,&local_90);
  local_50._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"number_length_percent","");
  local_70._M_dataplus._M_p = (pointer)paVar3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pPVar7 = PropertyDefinition::AddParser(pPVar7,&local_50,&local_70);
  PVar5 = PropertyDefinition::GetId(pPVar7);
  this->edge_ids[3] = PVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"edge","");
  local_90._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"edge-top, edge-right, edge-bottom, edge-left","");
  EffectSpecification::RegisterShorthand(this_00,&local_b0,&local_90,Box);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((this->sprite_outer_id == Invalid) || (this->sprite_inner_id == Invalid)) {
    bVar6 = Assert("RMLUI_ASSERT(sprite_outer_id != PropertyId::Invalid && sprite_inner_id != PropertyId::Invalid)"
                   ,
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DecoratorNinePatch.cpp"
                   ,0xc3);
    if (!bVar6) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"decorator","");
  local_90._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"outer, inner, edge?","");
  EffectSpecification::RegisterShorthand(this_00,&local_b0,&local_90,RecursiveCommaSeparated);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

DecoratorNinePatchInstancer::DecoratorNinePatchInstancer()
{
	sprite_outer_id = RegisterProperty("outer", "").AddParser("string").GetId();
	sprite_inner_id = RegisterProperty("inner", "").AddParser("string").GetId();
	edge_ids[0] = RegisterProperty("edge-top", "0px").AddParser("number_length_percent").GetId();
	edge_ids[1] = RegisterProperty("edge-right", "0px").AddParser("number_length_percent").GetId();
	edge_ids[2] = RegisterProperty("edge-bottom", "0px").AddParser("number_length_percent").GetId();
	edge_ids[3] = RegisterProperty("edge-left", "0px").AddParser("number_length_percent").GetId();

	RegisterShorthand("edge", "edge-top, edge-right, edge-bottom, edge-left", ShorthandType::Box);

	RMLUI_ASSERT(sprite_outer_id != PropertyId::Invalid && sprite_inner_id != PropertyId::Invalid);

	RegisterShorthand("decorator", "outer, inner, edge?", ShorthandType::RecursiveCommaSeparated);
}